

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_state.cpp
# Opt level: O2

void __thiscall
duckdb::SortLayout::SortLayout(SortLayout *this,vector<duckdb::BoundOrderByNode,_true> *orders)

{
  vector<duckdb::BaseStatistics_*,_true> *this_00;
  PhysicalType type;
  vector<duckdb::OrderType,_std::allocator<duckdb::OrderType>_> *pvVar1;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *pvVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  vector<duckdb::OrderByNullType,_std::allocator<duckdb::OrderByNullType>_> *pvVar4;
  vector<duckdb::BaseStatistics_*,_std::allocator<duckdb::BaseStatistics_*>_> *pvVar5;
  idx_t iVar6;
  pointer pLVar7;
  pointer pLVar8;
  bool bVar9;
  uint32_t uVar10;
  const_reference __x;
  type pEVar11;
  reference ppBVar12;
  reference pvVar13;
  idx_t iVar14;
  reference pvVar15;
  ulong *puVar16;
  mapped_type *pmVar17;
  ulong uVar18;
  ulong uVar19;
  idx_t col_idx;
  ulong __n;
  ulong uVar20;
  undefined1 auVar21 [16];
  reference rVar22;
  reference rVar23;
  idx_t col_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_c0;
  vector<bool,_std::allocator<bool>_> *local_b8;
  vector<duckdb::LogicalType,_true> *local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_a8;
  vector<bool,_std::allocator<bool>_> *local_a0;
  RowLayout *local_98;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_90;
  vector<duckdb::OrderByNullType,_true> *local_88;
  vector<duckdb::OrderType,_true> *local_80;
  vector<duckdb::LogicalType,_true> blob_layout_types;
  unsigned_long local_50;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  this->column_count =
       ((long)(orders->
              super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
              super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)(orders->
             super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
             super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  local_80 = &this->order_types;
  local_88 = &this->order_by_null_types;
  pvVar1 = &(this->order_types).super_vector<duckdb::OrderType,_std::allocator<duckdb::OrderType>_>;
  (pvVar1->super__Vector_base<duckdb::OrderType,_std::allocator<duckdb::OrderType>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->super__Vector_base<duckdb::OrderType,_std::allocator<duckdb::OrderType>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->order_types).super_vector<duckdb::OrderType,_std::allocator<duckdb::OrderType>_>.
    super__Vector_base<duckdb::OrderType,_std::allocator<duckdb::OrderType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  pvVar4 = &(this->order_by_null_types).
            super_vector<duckdb::OrderByNullType,_std::allocator<duckdb::OrderByNullType>_>;
  (pvVar4->super__Vector_base<duckdb::OrderByNullType,_std::allocator<duckdb::OrderByNullType>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar4->super__Vector_base<duckdb::OrderByNullType,_std::allocator<duckdb::OrderByNullType>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar2 = &(this->logical_types).
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
  (pvVar2->super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->logical_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->all_constant = true;
  (this->constant_size).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_b0 = &this->logical_types;
  *(uint *)((long)&(this->constant_size).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8) = 0;
  local_b8 = (vector<bool,_std::allocator<bool>_> *)&this->constant_size;
  (this->constant_size).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->constant_size).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  local_a8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->column_sizes;
  local_c0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->prefix_lengths;
  (this->has_null).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  this_00 = &this->stats;
  *(uint *)((long)&(this->has_null).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  local_a0 = (vector<bool,_std::allocator<bool>_> *)&this->has_null;
  local_98 = &this->blob_layout;
  *(undefined1 (*) [16])
   &(this->constant_size).super_vector<bool,_std::allocator<bool>_>.
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (undefined1  [16])0x0;
  pvVar3 = &(this->column_sizes).super_vector<unsigned_long,_std::allocator<unsigned_long>_>;
  (pvVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar3 = &(this->prefix_lengths).super_vector<unsigned_long,_std::allocator<unsigned_long>_>;
  (pvVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->prefix_lengths).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  pvVar5 = &(this->stats).
            super_vector<duckdb::BaseStatistics_*,_std::allocator<duckdb::BaseStatistics_*>_>;
  (pvVar5->super__Vector_base<duckdb::BaseStatistics_*,_std::allocator<duckdb::BaseStatistics_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar5->super__Vector_base<duckdb::BaseStatistics_*,_std::allocator<duckdb::BaseStatistics_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   ((long)&(this->stats).
           super_vector<duckdb::BaseStatistics_*,_std::allocator<duckdb::BaseStatistics_*>_>.
           super__Vector_base<duckdb::BaseStatistics_*,_std::allocator<duckdb::BaseStatistics_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   &(this->has_null).super_vector<bool,_std::allocator<bool>_>.
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (undefined1  [16])0x0;
  this->entry_size = 0;
  RowLayout::RowLayout(local_98);
  local_90 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->sorting_to_blob_col;
  (this->sorting_to_blob_col)._M_h._M_buckets = &(this->sorting_to_blob_col)._M_h._M_single_bucket;
  (this->sorting_to_blob_col)._M_h._M_bucket_count = 1;
  (this->sorting_to_blob_col)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->sorting_to_blob_col)._M_h._M_element_count = 0;
  (this->sorting_to_blob_col)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->sorting_to_blob_col)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  blob_layout_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  blob_layout_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  blob_layout_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar20 = 0;
  do {
    uVar19 = this->column_count;
    if (uVar19 <= uVar20) {
      uVar20 = this->comparison_size + 4;
      this->entry_size = uVar20;
      uVar20 = uVar20 & 7;
      if (uVar20 != 0) {
        uVar20 = 8 - uVar20;
        __n = 0;
        while ((__n < uVar19 && (uVar20 != 0))) {
          pvVar15 = vector<duckdb::LogicalType,_true>::get<true>(local_b0,__n);
          if (pvVar15->physical_type_ == VARCHAR) {
            ppBVar12 = vector<duckdb::BaseStatistics_*,_true>::get<true>(this_00,__n);
            if (*ppBVar12 != (value_type)0x0) {
              ppBVar12 = vector<duckdb::BaseStatistics_*,_true>::get<true>(this_00,__n);
              bVar9 = StringStats::HasMaxStringLength(*ppBVar12);
              if (bVar9) {
                ppBVar12 = vector<duckdb::BaseStatistics_*,_true>::get<true>(this_00,__n);
                uVar10 = StringStats::MaxStringLength(*ppBVar12);
                pvVar13 = vector<unsigned_long,_true>::get<true>
                                    ((vector<unsigned_long,_true> *)local_c0,__n);
                uVar19 = (ulong)uVar10 - *pvVar13;
                if (uVar19 != 0) {
                  uVar18 = uVar19;
                  if (uVar20 < uVar19) {
                    uVar18 = uVar20;
                  }
                  pvVar13 = vector<unsigned_long,_true>::get<true>
                                      ((vector<unsigned_long,_true> *)local_a8,__n);
                  *pvVar13 = *pvVar13 + uVar18;
                  pvVar13 = vector<unsigned_long,_true>::get<true>
                                      ((vector<unsigned_long,_true> *)local_c0,__n);
                  *pvVar13 = *pvVar13 + uVar18;
                  rVar23 = vector<bool,_true>::get<true>((vector<bool,_true> *)local_b8,__n);
                  puVar16 = rVar23._M_p;
                  if (uVar20 < uVar19) {
                    uVar19 = ~rVar23._M_mask & *puVar16;
                  }
                  else {
                    uVar19 = rVar23._M_mask | *puVar16;
                  }
                  *puVar16 = uVar19;
                  auVar21._8_4_ = (int)uVar18;
                  auVar21._0_8_ = uVar18;
                  auVar21._12_4_ = (int)(uVar18 >> 0x20);
                  this->comparison_size = uVar18 + this->comparison_size;
                  this->entry_size = auVar21._8_8_ + this->entry_size;
                  uVar20 = uVar20 - uVar18;
                }
              }
            }
          }
          __n = __n + 1;
          uVar19 = this->column_count;
        }
        this->entry_size = this->entry_size + 7 & 0xfffffffffffffff8;
      }
      for (col_size = 0; col_size < uVar19; col_size = col_size + 1) {
        if (this->all_constant == true) {
          rVar23 = vector<bool,_true>::get<true>((vector<bool,_true> *)local_b8,col_size);
          bVar9 = (*rVar23._M_p & rVar23._M_mask) != 0;
        }
        else {
          bVar9 = false;
        }
        this->all_constant = bVar9;
        rVar23 = vector<bool,_true>::get<true>((vector<bool,_true> *)local_b8,col_size);
        if ((*rVar23._M_p & rVar23._M_mask) == 0) {
          pLVar7 = blob_layout_types.
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pLVar8 = blob_layout_types.
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pmVar17 = ::std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_90,&col_size);
          *pmVar17 = ((long)pLVar8 - (long)pLVar7) / 0x18;
          pvVar15 = vector<duckdb::LogicalType,_true>::get<true>(local_b0,col_size);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    (&blob_layout_types.
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                     pvVar15);
        }
        uVar19 = this->column_count;
      }
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_48,
                 &blob_layout_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      RowLayout::Initialize(local_98,(vector<duckdb::LogicalType,_true> *)&local_48,true);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                (&blob_layout_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      return;
    }
    __x = vector<duckdb::BoundOrderByNode,_true>::get<true>(orders,uVar20);
    ::std::vector<duckdb::OrderType,_std::allocator<duckdb::OrderType>_>::push_back
              (&local_80->super_vector<duckdb::OrderType,_std::allocator<duckdb::OrderType>_>,
               &__x->type);
    ::std::vector<duckdb::OrderByNullType,_std::allocator<duckdb::OrderByNullType>_>::push_back
              (&local_88->
                super_vector<duckdb::OrderByNullType,_std::allocator<duckdb::OrderByNullType>_>,
               &__x->null_order);
    pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*(&__x->expression);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&local_b0->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &pEVar11->return_type);
    type = (pEVar11->return_type).physical_type_;
    bVar9 = TypeIsConstantSize(type);
    ::std::vector<bool,_std::allocator<bool>_>::push_back(local_b8,bVar9);
    col_size = (idx_t)(__x->stats).
                      super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                      .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
    if ((BaseStatistics *)col_size == (BaseStatistics *)0x0) {
      col_size = 0;
      ::std::vector<duckdb::BaseStatistics*,std::allocator<duckdb::BaseStatistics*>>::
      emplace_back<duckdb::BaseStatistics*>
                ((vector<duckdb::BaseStatistics*,std::allocator<duckdb::BaseStatistics*>> *)this_00,
                 (BaseStatistics **)&col_size);
      bVar9 = true;
    }
    else {
      ::std::vector<duckdb::BaseStatistics*,std::allocator<duckdb::BaseStatistics*>>::
      emplace_back<duckdb::BaseStatistics*>
                ((vector<duckdb::BaseStatistics*,std::allocator<duckdb::BaseStatistics*>> *)this_00,
                 (BaseStatistics **)&col_size);
      ppBVar12 = vector<duckdb::BaseStatistics_*,_true>::back(this_00);
      bVar9 = BaseStatistics::CanHaveNull(*ppBVar12);
    }
    ::std::vector<bool,_std::allocator<bool>_>::push_back(local_a0,bVar9);
    rVar22 = vector<bool,_true>::back((vector<bool,_true> *)local_a0);
    col_size = (idx_t)((*rVar22._M_p & rVar22._M_mask) != 0);
    local_50 = 0;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (local_c0,&local_50);
    bVar9 = TypeIsConstantSize(type);
    iVar14 = col_size;
    if (type == VARCHAR || bVar9) {
      if (type == VARCHAR) {
        ppBVar12 = vector<duckdb::BaseStatistics_*,_true>::back(this_00);
        if (*ppBVar12 == (value_type)0x0) {
LAB_00912d95:
          col_size = 0xc;
        }
        else {
          ppBVar12 = vector<duckdb::BaseStatistics_*,_true>::back(this_00);
          bVar9 = StringStats::HasMaxStringLength(*ppBVar12);
          if (!bVar9) goto LAB_00912d95;
          ppBVar12 = vector<duckdb::BaseStatistics_*,_true>::back(this_00);
          uVar10 = StringStats::MaxStringLength(*ppBVar12);
          col_size = uVar10 + col_size;
          if (0xc < col_size) goto LAB_00912d95;
          rVar22 = vector<bool,_true>::back((vector<bool,_true> *)local_b8);
          *rVar22._M_p = *rVar22._M_p | rVar22._M_mask;
        }
        iVar6 = col_size;
        pvVar13 = vector<unsigned_long,_true>::back((vector<unsigned_long,_true> *)local_c0);
        *pvVar13 = iVar6 - iVar14;
      }
      else {
        iVar14 = GetTypeIdSize(type);
        col_size = col_size + iVar14;
      }
    }
    else {
      iVar14 = GetNestedSortingColSize(&col_size,&pEVar11->return_type);
      pvVar13 = vector<unsigned_long,_true>::back((vector<unsigned_long,_true> *)local_c0);
      *pvVar13 = iVar14;
    }
    this->comparison_size = this->comparison_size + col_size;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(local_a8,&col_size);
    uVar20 = uVar20 + 1;
  } while( true );
}

Assistant:

SortLayout::SortLayout(const vector<BoundOrderByNode> &orders)
    : column_count(orders.size()), all_constant(true), comparison_size(0), entry_size(0) {
	vector<LogicalType> blob_layout_types;
	for (idx_t i = 0; i < column_count; i++) {
		const auto &order = orders[i];

		order_types.push_back(order.type);
		order_by_null_types.push_back(order.null_order);
		auto &expr = *order.expression;
		logical_types.push_back(expr.return_type);

		auto physical_type = expr.return_type.InternalType();
		constant_size.push_back(TypeIsConstantSize(physical_type));

		if (order.stats) {
			stats.push_back(order.stats.get());
			has_null.push_back(stats.back()->CanHaveNull());
		} else {
			stats.push_back(nullptr);
			has_null.push_back(true);
		}

		idx_t col_size = has_null.back() ? 1 : 0;
		prefix_lengths.push_back(0);
		if (!TypeIsConstantSize(physical_type) && physical_type != PhysicalType::VARCHAR) {
			prefix_lengths.back() = GetNestedSortingColSize(col_size, expr.return_type);
		} else if (physical_type == PhysicalType::VARCHAR) {
			idx_t size_before = col_size;
			if (stats.back() && StringStats::HasMaxStringLength(*stats.back())) {
				col_size += StringStats::MaxStringLength(*stats.back());
				if (col_size > 12) {
					col_size = 12;
				} else {
					constant_size.back() = true;
				}
			} else {
				col_size = 12;
			}
			prefix_lengths.back() = col_size - size_before;
		} else {
			col_size += GetTypeIdSize(physical_type);
		}

		comparison_size += col_size;
		column_sizes.push_back(col_size);
	}
	entry_size = comparison_size + sizeof(uint32_t);

	// 8-byte alignment
	if (entry_size % 8 != 0) {
		// First assign more bytes to strings instead of aligning
		idx_t bytes_to_fill = 8 - (entry_size % 8);
		for (idx_t col_idx = 0; col_idx < column_count; col_idx++) {
			if (bytes_to_fill == 0) {
				break;
			}
			if (logical_types[col_idx].InternalType() == PhysicalType::VARCHAR && stats[col_idx] &&
			    StringStats::HasMaxStringLength(*stats[col_idx])) {
				idx_t diff = StringStats::MaxStringLength(*stats[col_idx]) - prefix_lengths[col_idx];
				if (diff > 0) {
					// Increase all sizes accordingly
					idx_t increase = MinValue(bytes_to_fill, diff);
					column_sizes[col_idx] += increase;
					prefix_lengths[col_idx] += increase;
					constant_size[col_idx] = increase == diff;
					comparison_size += increase;
					entry_size += increase;
					bytes_to_fill -= increase;
				}
			}
		}
		entry_size = AlignValue(entry_size);
	}

	for (idx_t col_idx = 0; col_idx < column_count; col_idx++) {
		all_constant = all_constant && constant_size[col_idx];
		if (!constant_size[col_idx]) {
			sorting_to_blob_col[col_idx] = blob_layout_types.size();
			blob_layout_types.push_back(logical_types[col_idx]);
		}
	}

	blob_layout.Initialize(blob_layout_types);
}